

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.h
# Opt level: O0

void __thiscall google::base::Logger::Logger(Logger *this)

{
  Logger *this_local;
  
  this->_vptr_Logger = (_func_int **)&PTR__Logger_0016c790;
  return;
}

Assistant:

class GLOG_EXPORT Logger {
 public:
  virtual ~Logger();

  // Writes "message[0,message_len-1]" corresponding to an event that
  // occurred at "timestamp".  If "force_flush" is true, the log file
  // is flushed immediately.
  //
  // The input message has already been formatted as deemed
  // appropriate by the higher level logging facility.  For example,
  // textual log messages already contain timestamps, and the
  // file:linenumber header.
  [[deprecated(
      "Logger::Write accepting a std::time_t timestamp is provided for "
      "compatibility purposes only. New code should implement the "
      "std::chrono::system_clock::time_point overload.")]] virtual void
  Write(bool force_flush, time_t timestamp, const char* message,
        size_t message_len);
  virtual void Write(bool force_flush,
                     const std::chrono::system_clock::time_point& timestamp,
                     const char* message, size_t message_len);

  // Flush any buffered messages
  virtual void Flush() = 0;

  // Get the current LOG file size.
  // The returned value is approximate since some
  // logged data may not have been flushed to disk yet.
  virtual uint32 LogSize() = 0;
}